

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode cr_lc_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                   _Bool *peos)

{
  bufq *q;
  void *pvVar1;
  Curl_creader *pCVar2;
  long lVar3;
  curl_trc_feat *pcVar4;
  size_t sVar5;
  _Bool _Var6;
  byte bVar7;
  CURLcode CVar8;
  void *pvVar9;
  ulong uVar10;
  byte bVar11;
  _Bool *p_Var12;
  ulong uVar13;
  _Bool eos;
  size_t nread;
  size_t n;
  _Bool local_71;
  Curl_easy *local_70;
  char *local_68;
  size_t *local_60;
  ulong local_58;
  size_t local_50;
  _Bool *local_48;
  size_t local_40;
  size_t local_38;
  
  pvVar1 = reader->ctx;
  if ((*(byte *)((long)pvVar1 + 0x60) & 2) != 0) {
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  q = (bufq *)((long)pvVar1 + 0x20);
  local_70 = data;
  local_50 = blen;
  local_48 = peos;
  _Var6 = Curl_bufq_is_empty(q);
  if (_Var6) {
    if ((*(byte *)((long)pvVar1 + 0x60) & 1) != 0) {
      *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
      *pnread = 0;
      *local_48 = true;
      return CURLE_OK;
    }
    pCVar2 = reader->next;
    local_40 = 0;
    local_71 = false;
    if (pCVar2 == (Curl_creader *)0x0) {
      return CURLE_READ_ERROR;
    }
    CVar8 = (*pCVar2->crt->do_read)(local_70,pCVar2,buf,local_50,&local_40,&local_71);
    sVar5 = local_40;
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    bVar11 = *(byte *)((long)pvVar1 + 0x60) & 0xfe | local_71;
    *(byte *)((long)pvVar1 + 0x60) = bVar11;
    bVar7 = local_71;
    if (local_40 != 0) {
      local_58 = CONCAT71(local_58._1_7_,local_71);
      pvVar9 = memchr(buf,10,local_40);
      bVar7 = (byte)local_58;
      if (pvVar9 != (void *)0x0) {
        uVar13 = 0;
        uVar10 = 0;
        local_68 = buf;
        local_60 = pnread;
        do {
          if ((buf[uVar10] == '\n') && ((*(byte *)((long)pvVar1 + 0x60) & 4) == 0)) {
            local_58 = uVar10;
            CVar8 = Curl_bufq_cwrite(q,buf + uVar13,uVar10 - uVar13,&local_38);
            if (CVar8 != CURLE_OK) {
              return CVar8;
            }
            CVar8 = Curl_bufq_cwrite(q,"\r\n",2,&local_38);
            if (CVar8 != CURLE_OK) {
              return CVar8;
            }
            uVar10 = local_58 + 1;
            buf = local_68;
            uVar13 = uVar10;
            pnread = local_60;
            if ((((local_70->set).field_0x8ca & 0x20) == 0) &&
               (lVar3 = (local_70->state).infilesize, lVar3 != -1)) {
              (local_70->state).infilesize = lVar3 + 1;
            }
          }
          else {
            *(byte *)((long)pvVar1 + 0x60) =
                 *(byte *)((long)pvVar1 + 0x60) & 0xfb | (buf[uVar10] == '\r') << 2;
            uVar10 = uVar10 + 1;
          }
        } while (uVar10 < local_40);
        if ((uVar13 <= uVar10 && uVar10 - uVar13 != 0) &&
           (CVar8 = Curl_bufq_cwrite(q,buf + uVar13,uVar10 - uVar13,&local_38), CVar8 != CURLE_OK))
        {
          return CVar8;
        }
        goto LAB_0014e287;
      }
    }
    if (bVar7 != 0) {
      *(byte *)((long)pvVar1 + 0x60) = bVar11 | 2;
    }
    *pnread = sVar5;
    _Var6 = (_Bool)(*(byte *)((long)pvVar1 + 0x60) >> 1 & 1);
    p_Var12 = local_48;
  }
  else {
LAB_0014e287:
    p_Var12 = local_48;
    *local_48 = false;
    CVar8 = Curl_bufq_cread(q,buf,local_50,pnread);
    uVar13 = (ulong)CVar8;
    if (((CVar8 != CURLE_OK) || (uVar13 = 0, (*(byte *)((long)pvVar1 + 0x60) & 1) == 0)) ||
       (_Var6 = Curl_bufq_is_empty(q), !_Var6)) goto LAB_0014e2fa;
    *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
    _Var6 = true;
  }
  *p_Var12 = _Var6;
  uVar13 = 0;
LAB_0014e2fa:
  if ((((local_70 != (Curl_easy *)0x0) && (((local_70->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar4 = (local_70->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
      ) && (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(local_70,"cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",local_50,uVar13,*pnread,
                  (ulong)*p_Var12);
  }
  return (CURLcode)uVar13;
}

Assistant:

static CURLcode cr_lc_read(struct Curl_easy *data,
                           struct Curl_creader *reader,
                           char *buf, size_t blen,
                           size_t *pnread, bool *peos)
{
  struct cr_lc_ctx *ctx = reader->ctx;
  CURLcode result;
  size_t nread, i, start, n;
  bool eos;

  if(ctx->eos) {
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }

  if(Curl_bufq_is_empty(&ctx->buf)) {
    if(ctx->read_eos) {
      ctx->eos = TRUE;
      *pnread = 0;
      *peos = TRUE;
      return CURLE_OK;
    }
    /* Still getting data form the next reader, ctx->buf is empty */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;
    ctx->read_eos = eos;

    if(!nread || !memchr(buf, '\n', nread)) {
      /* nothing to convert, return this right away */
      if(ctx->read_eos)
        ctx->eos = TRUE;
      *pnread = nread;
      *peos = ctx->eos;
      goto out;
    }

    /* at least one \n might need conversion to '\r\n', place into ctx->buf */
    for(i = start = 0; i < nread; ++i) {
      /* if this byte is not an LF character, or if the preceding character is
         a CR (meaning this already is a CRLF pair), go to next */
      if((buf[i] != '\n') || ctx->prev_cr) {
        ctx->prev_cr = (buf[i] == '\r');
        continue;
      }
      ctx->prev_cr = FALSE;
      /* on a soft limit bufq, we do not need to check length */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(!result)
        result = Curl_bufq_cwrite(&ctx->buf, STRCONST("\r\n"), &n);
      if(result)
        return result;
      start = i + 1;
      if(!data->set.crlf && (data->state.infilesize != -1)) {
        /* we are here only because FTP is in ASCII mode...
           bump infilesize for the LF we just added */
        data->state.infilesize++;
        /* comment: this might work for FTP, but in HTTP we could not change
         * the content length after having started the request... */
      }
    }

    if(start < i) { /* leftover */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(result)
        return result;
    }
  }

  DEBUGASSERT(!Curl_bufq_is_empty(&ctx->buf));
  *peos = FALSE;
  result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  if(!result && ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
    *peos = TRUE;
  }

out:
  CURL_TRC_READ(data, "cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",
                blen, result, *pnread, *peos);
  return result;
}